

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

uint32_t unicode_cpt_from_utf8(string *utf8,size_t *offset)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  char *pcVar6;
  byte *pbVar7;
  invalid_argument *piVar8;
  ulong uVar9;
  long *in_RSI;
  ulong in_RDI;
  int result_3;
  int result_2;
  int result_1;
  value_type result;
  
  pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI);
  if (((int)*pcVar6 & 0x80U) == 0) {
    pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI);
    cVar1 = *pcVar6;
    *in_RSI = *in_RSI + 1;
    return (int)cVar1;
  }
  pbVar7 = (byte *)std::__cxx11::string::operator[](in_RDI);
  if ((*pbVar7 & 0x40) == 0) {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar8,"invalid character");
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pbVar7 = (byte *)std::__cxx11::string::operator[](in_RDI);
  if ((*pbVar7 & 0x20) == 0) {
    lVar5 = *in_RSI;
    uVar9 = std::__cxx11::string::size();
    if ((lVar5 + 1U < uVar9) &&
       (pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI), ((int)*pcVar6 & 0xc0U) == 0x80))
    {
      pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI);
      cVar1 = *pcVar6;
      pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI);
      cVar2 = *pcVar6;
      *in_RSI = *in_RSI + 2;
      return ((int)cVar1 & 0x1fU) << 6 | (int)cVar2 & 0x3fU;
    }
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar8,"invalid character");
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pbVar7 = (byte *)std::__cxx11::string::operator[](in_RDI);
  if ((*pbVar7 & 0x10) == 0) {
    lVar5 = *in_RSI;
    uVar9 = std::__cxx11::string::size();
    if (((lVar5 + 2U < uVar9) &&
        (pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI), ((int)*pcVar6 & 0xc0U) == 0x80))
       && (pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI), ((int)*pcVar6 & 0xc0U) == 0x80
          )) {
      pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI);
      cVar1 = *pcVar6;
      pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI);
      cVar2 = *pcVar6;
      pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI);
      cVar3 = *pcVar6;
      *in_RSI = *in_RSI + 3;
      return ((int)cVar1 & 0xfU) << 0xc | ((int)cVar2 & 0x3fU) << 6 | (int)cVar3 & 0x3fU;
    }
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar8,"invalid character");
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pbVar7 = (byte *)std::__cxx11::string::operator[](in_RDI);
  if ((*pbVar7 & 8) != 0) {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar8,"failed to convert utf8 to codepoint");
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  lVar5 = *in_RSI;
  uVar9 = std::__cxx11::string::size();
  if ((((lVar5 + 3U < uVar9) &&
       (pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI), ((int)*pcVar6 & 0xc0U) == 0x80))
      && (pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI), ((int)*pcVar6 & 0xc0U) == 0x80)
      ) && (pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI),
           ((int)*pcVar6 & 0xc0U) == 0x80)) {
    pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI);
    cVar1 = *pcVar6;
    pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI);
    cVar2 = *pcVar6;
    pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI);
    cVar3 = *pcVar6;
    pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI);
    cVar4 = *pcVar6;
    *in_RSI = *in_RSI + 4;
    return ((int)cVar1 & 7U) << 0x12 | ((int)cVar2 & 0x3fU) << 0xc | ((int)cVar3 & 0x3fU) << 6 |
           (int)cVar4 & 0x3fU;
  }
  piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar8,"invalid character");
  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

uint32_t unicode_cpt_from_utf8(const std::string & utf8, size_t & offset) {
    assert(offset < utf8.size());
    if (!(utf8[offset + 0] & 0x80)) {
        auto result = utf8[offset + 0];
        offset += 1;
        return result;
    }
    if (!(utf8[offset + 0] & 0x40)) {
        throw std::invalid_argument("invalid character");
    }
    if (!(utf8[offset + 0] & 0x20)) {
        if (offset + 1 >= utf8.size() || ! ((utf8[offset + 1] & 0xc0) == 0x80)) {
            throw std::invalid_argument("invalid character");
        }
        auto result = ((utf8[offset + 0] & 0x1f) << 6) | (utf8[offset + 1] & 0x3f);
        offset += 2;
        return result;
    }
    if (!(utf8[offset + 0] & 0x10)) {
        if (offset + 2 >= utf8.size() || ! ((utf8[offset + 1] & 0xc0) == 0x80) || ! ((utf8[offset + 2] & 0xc0) == 0x80)) {
            throw std::invalid_argument("invalid character");
        }
        auto result = ((utf8[offset + 0] & 0x0f) << 12) | ((utf8[offset + 1] & 0x3f) << 6) | (utf8[offset + 2] & 0x3f);
        offset += 3;
        return result;
    }
    if (!(utf8[offset + 0] & 0x08)) {
        if (offset + 3 >= utf8.size() || ! ((utf8[offset + 1] & 0xc0) == 0x80) || ! ((utf8[offset + 2] & 0xc0) == 0x80) || !((utf8[offset + 3] & 0xc0) == 0x80)) {
            throw std::invalid_argument("invalid character");
        }
        auto result = ((utf8[offset + 0] & 0x07) << 18) | ((utf8[offset + 1] & 0x3f) << 12) | ((utf8[offset + 2] & 0x3f) << 6) | (utf8[offset + 3] & 0x3f);
        offset += 4;
        return result;
    }
    throw std::invalid_argument("failed to convert utf8 to codepoint");
}